

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSparsityPatternLearner.h
# Opt level: O2

void __thiscall chrono::ChSparsityPatternLearner::process(ChSparsityPatternLearner *this)

{
  pointer plVar1;
  pointer piVar2;
  size_t sVar3;
  size_t *psVar4;
  long lVar5;
  pointer plVar6;
  
  plVar6 = (this->innerVectors).
           super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = -(long)plVar6;
  for (; plVar6 != (this->innerVectors).
                   super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; plVar6 = plVar6 + 1) {
    std::__cxx11::list<int,_std::allocator<int>_>::sort(plVar6);
    std::__cxx11::list<int,_std::allocator<int>_>::unique(plVar6);
    lVar5 = lVar5 + -0x18;
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&this->innerVectors_size,
             -((long)&(((this->innerVectors).
                        super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__List_base<int,_std::allocator<int>_>)._M_impl._M_node + lVar5) / 0x18);
  plVar6 = (this->innerVectors).
           super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  plVar1 = (this->innerVectors).
           super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar4 = (size_t *)
           ((long)&(plVar6->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node + 0x10);
  piVar2 = (this->innerVectors_size).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar5 = 0; ((long)plVar1 - (long)plVar6) / 0x18 != lVar5; lVar5 = lVar5 + 1) {
    sVar3 = *psVar4;
    psVar4 = psVar4 + 3;
    piVar2[lVar5] = (int)sVar3;
  }
  this->processed = true;
  return;
}

Assistant:

void process() {
        // Find the unique indices of non-zero elements in each inner vector
        for (auto vec = innerVectors.begin(); vec != innerVectors.end(); ++vec) {
            vec->sort();
            vec->unique();
        }

        // Cache the number of non-zero elements in each inner vector
        // (in each row if RowMajor, in each column if ColMajor)
        innerVectors_size.resize(innerVectors.size());
        for (auto i = 0; i < innerVectors.size(); ++i) {
            innerVectors_size[i] = static_cast<int>(innerVectors[i].size());
        }

        processed = true;
    }